

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree.cpp
# Opt level: O0

int __thiscall b_tree::remove(b_tree *this,char *__filename)

{
  int64_t *extraout_RAX;
  undefined1 local_88 [8];
  b_tree_node root;
  uint64_t root_ofs;
  int64_t k_local;
  b_tree *this_local;
  
  root._child_ofs_field = (int64_t *)pager::root_ofs(&this->_p);
  if (root._child_ofs_field != (int64_t *)0x0) {
    b_tree_node::b_tree_node((b_tree_node *)local_88,&this->_p,(int64_t)root._child_ofs_field);
    b_tree_node::_remove((b_tree_node *)local_88,(int64_t)__filename);
    b_tree_node::~b_tree_node((b_tree_node *)local_88);
    root._child_ofs_field = extraout_RAX;
  }
  return (int)root._child_ofs_field;
}

Assistant:

void b_tree::remove(int64_t k)
{
    auto root_ofs = _p.root_ofs();
    if (root_ofs != 0)
    {
        b_tree_node root(_p, root_ofs);
        root._remove(k);
    }
}